

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobject.h
# Opt level: O3

PClassInventory * dyn_cast<PClassInventory>(DObject *p)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  bool bVar4;
  PClass *pPVar3;
  
  pPVar1 = PClassInventory::RegistrationInfo.MyClass;
  if (p != (DObject *)0x0) {
    pPVar3 = p->Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**p->_vptr_DObject)(p);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      p->Class = pPVar3;
    }
    bVar4 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar1 && bVar4) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar4 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar1) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (bVar4) {
      return (PClassInventory *)p;
    }
  }
  return (PClassInventory *)0x0;
}

Assistant:

T *dyn_cast(DObject *p)
{
	if (p != NULL && p->IsKindOf(RUNTIME_CLASS_CASTLESS(T)))
	{
		return static_cast<T *>(p);
	}
	return NULL;
}